

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-solver.cc
# Opt level: O2

void __thiscall
mp::NLFeeder_Easy::
FeedConBounds<mp::NLWriter2<mp::NLWriter2Params<mp::BinaryFormatter,mp::NLFeeder_Easy>>::ConBndWriter>
          (NLFeeder_Easy *this,ConBndWriter *cbw)

{
  AlgConRange acr;
  int j;
  long lVar1;
  
  for (lVar1 = 0;
      lVar1 < (this->header_).super_NLProblemInfo.super_NLProblemInfo_C.num_algebraic_cons;
      lVar1 = lVar1 + 1) {
    acr.U = (this->nlme_).row_ub_[lVar1];
    acr.L = (this->nlme_).row_lb_[lVar1];
    acr.k = 0;
    acr.cvar = 0;
    NLWriter2<mp::NLWriter2Params<mp::BinaryFormatter,mp::NLFeeder_Easy>>::ConBndWriter::
    WriteAlgConRange<mp::NLFeeder<mp::NLFeeder_Easy,void*>::AlgConRange>((ConBndWriter *)cbw,acr);
  }
  return;
}

Assistant:

void FeedConBounds(ConBoundsWriter& cbw) {
    for (int j=0; j<header_.num_algebraic_cons; j++) {
      AlgConRange bnd;
      bnd.L = NLME().RowLowerBounds()[j];
      bnd.U = NLME().RowUpperBounds()[j];
      cbw.WriteAlgConRange(bnd);
    }
  }